

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node_struct *root,char_t *indent,uint flags,
               uint depth)

{
  uint uVar1;
  size_t indent_length;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  xml_node_struct *pxVar5;
  xml_node_struct *node;
  byte bVar6;
  char *data;
  bool bVar7;
  
  cVar2 = (char)((flags & 4) >> 2);
  if (cVar2 == '\0' && (flags & 0x41) != 0) {
    indent_length = strlen(indent);
  }
  else {
    indent_length = 0;
  }
  bVar6 = 2;
  bVar7 = false;
  node = root;
  do {
    if (((uint)node->header & 0xf) - 3 < 2) {
      node_output_simple(writer,node,flags);
      bVar6 = 0;
      bVar7 = false;
LAB_00118ad6:
      while ((pxVar5 = node, node != root &&
             (pxVar5 = node->next_sibling, pxVar5 == (xml_node_struct *)0x0))) {
        node = node->parent;
        if ((node->header & 0xf) == 2) {
          if (bVar7 && cVar2 == '\0') {
            uVar3 = writer->bufsize;
            if (0x7ff < uVar3) {
              xml_buffered_writer::flush(writer,writer->buffer,uVar3);
              writer->bufsize = 0;
              uVar3 = 0;
            }
            writer->buffer[uVar3] = '\n';
            writer->bufsize = uVar3 + 1;
          }
          depth = depth - 1;
          data = node->name;
          if (data == (char_t *)0x0) {
            data = ":anonymous";
          }
LAB_00118b7b:
          uVar3 = writer->bufsize;
          if (0x7fe < uVar3) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar3);
            writer->bufsize = 0;
            uVar3 = 0;
          }
          (writer->buffer + uVar3)[0] = '<';
          (writer->buffer + uVar3)[1] = '/';
          writer->bufsize = uVar3 + 2;
LAB_00118bb4:
          xml_buffered_writer::write_string(writer,data);
          uVar3 = writer->bufsize;
          if (0x7ff < uVar3) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar3);
            writer->bufsize = 0;
            uVar3 = 0;
          }
          writer->buffer[uVar3] = '>';
          sVar4 = uVar3 + 1;
LAB_00118bee:
          writer->bufsize = sVar4;
LAB_00118bf5:
          bVar6 = 3;
          bVar7 = true;
        }
      }
    }
    else {
      if (((flags & 4) == 0) && (bVar7)) {
        uVar3 = writer->bufsize;
        if (0x7ff < uVar3) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar3);
          writer->bufsize = 0;
          uVar3 = 0;
        }
        writer->buffer[uVar3] = '\n';
        writer->bufsize = uVar3 + 1;
      }
      if ((indent_length != 0) && ((bVar6 & 2) != 0)) {
        text_output_indent(writer,indent,indent_length,depth);
      }
      uVar1 = (uint)node->header & 0xf;
      if (uVar1 == 1) {
        pxVar5 = node->first_child;
        bVar6 = 2;
        bVar7 = false;
        if (pxVar5 == (xml_node_struct *)0x0) goto LAB_00118ad6;
      }
      else {
        if (uVar1 != 2) {
          node_output_simple(writer,node,flags);
          goto LAB_00118bf5;
        }
        data = node->name;
        if (data == (char_t *)0x0) {
          data = ":anonymous";
        }
        uVar3 = writer->bufsize;
        if (0x7ff < uVar3) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar3);
          writer->bufsize = 0;
          uVar3 = 0;
        }
        writer->buffer[uVar3] = '<';
        writer->bufsize = uVar3 + 1;
        xml_buffered_writer::write_string(writer,data);
        if (node->first_attribute != (xml_attribute_struct *)0x0) {
          node_output_attributes(writer,node,indent,indent_length,flags,depth);
        }
        if (node->value == (char_t *)0x0) {
          if (node->first_child == (xml_node_struct *)0x0) {
            if (-1 < (char)flags) {
              if ((flags & 4) == 0) {
                uVar3 = writer->bufsize;
                if (0x7ff < uVar3) {
                  xml_buffered_writer::flush(writer,writer->buffer,uVar3);
                  writer->bufsize = 0;
                  uVar3 = 0;
                }
                writer->buffer[uVar3] = ' ';
                writer->bufsize = uVar3 + 1;
              }
              uVar3 = writer->bufsize;
              if (0x7fe < uVar3) {
                xml_buffered_writer::flush(writer,writer->buffer,uVar3);
                writer->bufsize = 0;
                uVar3 = 0;
              }
              (writer->buffer + uVar3)[0] = '/';
              (writer->buffer + uVar3)[1] = '>';
              sVar4 = uVar3 + 2;
              goto LAB_00118bee;
            }
            xml_buffered_writer::write(writer,0x3e,(void *)0x3c,0x2f);
            goto LAB_00118bb4;
          }
          uVar3 = writer->bufsize;
          if (0x7ff < uVar3) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar3);
            writer->bufsize = 0;
            uVar3 = 0;
          }
          writer->buffer[uVar3] = '>';
          writer->bufsize = uVar3 + 1;
        }
        else {
          uVar3 = writer->bufsize;
          if (0x7ff < uVar3) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar3);
            writer->bufsize = 0;
            uVar3 = 0;
          }
          writer->buffer[uVar3] = '>';
          writer->bufsize = uVar3 + 1;
          text_output(writer,node->value,ctx_special_pcdata,flags);
          if (node->first_child == (xml_node_struct *)0x0) goto LAB_00118b7b;
        }
        bVar7 = node->value == (char_t *)0x0;
        bVar6 = bVar7 * '\x03';
        pxVar5 = node->first_child;
        depth = depth + 1;
      }
    }
    node = pxVar5;
    if (pxVar5 == root) {
      if (((flags & 4) == 0) && (bVar7)) {
        uVar3 = writer->bufsize;
        if (0x7ff < uVar3) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar3);
          writer->bufsize = 0;
          uVar3 = 0;
        }
        writer->buffer[uVar3] = '\n';
        writer->bufsize = uVar3 + 1;
      }
      return;
    }
  } while( true );
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, xml_node_struct* root, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		size_t indent_length = ((flags & (format_indent | format_indent_attributes)) && (flags & format_raw) == 0) ? strlength(indent) : 0;
		unsigned int indent_flags = indent_indent;

		xml_node_struct* node = root;

		do
		{
			assert(node);

			// begin writing current node
			if (PUGI__NODETYPE(node) == node_pcdata || PUGI__NODETYPE(node) == node_cdata)
			{
				node_output_simple(writer, node, flags);

				indent_flags = 0;
			}
			else
			{
				if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
					writer.write('\n');

				if ((indent_flags & indent_indent) && indent_length)
					text_output_indent(writer, indent, indent_length, depth);

				if (PUGI__NODETYPE(node) == node_element)
				{
					indent_flags = indent_newline | indent_indent;

					if (node_output_start(writer, node, indent, indent_length, flags, depth))
					{
						// element nodes can have value if parse_embed_pcdata was used
						if (node->value)
							indent_flags = 0;

						node = node->first_child;
						depth++;
						continue;
					}
				}
				else if (PUGI__NODETYPE(node) == node_document)
				{
					indent_flags = indent_indent;

					if (node->first_child)
					{
						node = node->first_child;
						continue;
					}
				}
				else
				{
					node_output_simple(writer, node, flags);

					indent_flags = indent_newline | indent_indent;
				}
			}

			// continue to the next node
			while (node != root)
			{
				if (node->next_sibling)
				{
					node = node->next_sibling;
					break;
				}

				node = node->parent;

				// write closing node
				if (PUGI__NODETYPE(node) == node_element)
				{
					depth--;

					if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
						writer.write('\n');

					if ((indent_flags & indent_indent) && indent_length)
						text_output_indent(writer, indent, indent_length, depth);

					node_output_end(writer, node);

					indent_flags = indent_newline | indent_indent;
				}
			}
		}
		while (node != root);

		if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
			writer.write('\n');
	}